

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool __thiscall EthBasePort::WriteBroadcastReadRequest(EthBasePort *this,uint seq)

{
  int iVar1;
  ostream *poVar2;
  
  if (this->useFwBridge == false) {
    iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x2f])(this);
    if (0 < iVar1) {
      poVar2 = std::operator<<((this->super_BasePort).outStr,"WriteBroadcastReadRequest: flushed ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2," packets");
      poVar2 = std::operator<<(poVar2,", seq = ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x24])
                    (this,0x3f,0x1800,(ulong)(seq << 0x10 | (this->super_BasePort).BoardInUseMask_))
  ;
  return SUB41(iVar1,0);
}

Assistant:

bool EthBasePort::WriteBroadcastReadRequest(unsigned int seq)
{
    if (!useFwBridge) {
        // Ethernet-only system automatically sends a response packet in response to
        // the broadcast read request, so we first flush any existing packets.
        // When using the Ethernet/Firewire bridge, the flush happens in ReadBlockNode,
        // which is called by BasePort::ReceiveBroadcastReadResponse.
        int numFlushed = PacketFlushAll();
        if (numFlushed > 0)
            outStr << "WriteBroadcastReadRequest: flushed " << numFlushed << " packets"
                   << ", seq = " << seq << std::endl;
    }
    quadlet_t bcReqData = (seq << 16) | BoardInUseMask_;
    return WriteQuadlet(FW_NODE_BROADCAST, 0x1800, bcReqData);
}